

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiListClipper::Begin(ImGuiListClipper *this,int count,float items_height)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiColumns *pIVar4;
  ImGuiContext *pIVar5;
  uint uVar6;
  float fVar7;
  
  this->StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
  this->ItemsHeight = items_height;
  this->ItemsCount = count;
  this->StepNo = 0;
  this->DisplayStart = -1;
  this->DisplayEnd = -1;
  if (0.0 < items_height) {
    ImGui::CalcListClipping(count,items_height,&this->DisplayStart,&this->DisplayEnd);
    pIVar5 = GImGui;
    if (0 < this->DisplayStart) {
      fVar1 = this->ItemsHeight;
      fVar7 = (float)this->DisplayStart * fVar1 + this->StartPosY;
      pIVar3 = GImGui->CurrentWindow;
      (pIVar3->DC).CursorPos.y = fVar7;
      fVar2 = (pIVar3->DC).CursorMaxPos.y;
      uVar6 = -(uint)(fVar7 <= fVar2);
      (pIVar3->DC).CursorMaxPos.y = (float)(uVar6 & (uint)fVar2 | ~uVar6 & (uint)fVar7);
      (pIVar3->DC).CursorPosPrevLine.y = fVar7 - fVar1;
      (pIVar3->DC).PrevLineSize.y = fVar1 - (pIVar5->Style).ItemSpacing.y;
      pIVar4 = (pIVar3->DC).CurrentColumns;
      if (pIVar4 != (ImGuiColumns *)0x0) {
        pIVar4->LineMinY = fVar7;
      }
    }
    this->StepNo = 2;
  }
  return;
}

Assistant:

void ImGuiListClipper::Begin(int count, float items_height)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    StartPosY = window->DC.CursorPos.y;
    ItemsHeight = items_height;
    ItemsCount = count;
    StepNo = 0;
    DisplayEnd = DisplayStart = -1;
    if (ItemsHeight > 0.0f)
    {
        ImGui::CalcListClipping(ItemsCount, ItemsHeight, &DisplayStart, &DisplayEnd); // calculate how many to clip/display
        if (DisplayStart > 0)
            SetCursorPosYAndSetupDummyPrevLine(StartPosY + DisplayStart * ItemsHeight, ItemsHeight); // advance cursor
        StepNo = 2;
    }
}